

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Matmul_patch(char transa,char transb,void *alpha,void *beta,int g_a,int ailo,int aihi,
                    int ajlo,int ajhi,int g_b,int bilo,int bihi,int bjlo,int bjhi,int g_c,int cilo,
                    int cihi,int cjlo,int cjhi)

{
  logical lVar1;
  long g_a_00;
  char transb_local;
  char transa_local;
  Integer local_88;
  Integer local_80;
  Integer local_78;
  Integer local_70;
  Integer local_68;
  void *local_60;
  void *local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  Integer local_38;
  
  g_a_00 = (long)g_a;
  local_88 = (Integer)(ailo + 1);
  local_38 = (Integer)(aihi + 1);
  local_40 = (Integer)(ajlo + 1);
  local_48 = (Integer)(ajhi + 1);
  local_50 = (Integer)(bilo + 1);
  local_68 = (Integer)(bihi + 1);
  local_70 = (Integer)(bjlo + 1);
  local_80 = (Integer)(bjhi + 1);
  local_78 = (Integer)g_b;
  transb_local = transb;
  transa_local = transa;
  local_60 = alpha;
  local_58 = beta;
  lVar1 = pnga_is_mirrored(g_a_00);
  if (lVar1 == 0) {
    gai_matmul_patch_flag(1);
    pnga_matmul(&transa_local,&transb_local,local_60,local_58,g_a_00,local_88,local_38,local_40,
                local_48,local_78,local_50,local_68,local_70,local_80,(long)g_c,(long)(cilo + 1),
                (long)(cihi + 1),(long)(cjlo + 1),(long)(cjhi + 1));
    gai_matmul_patch_flag(0);
  }
  else {
    pnga_matmul_mirrored
              (&transa_local,&transb_local,local_60,local_58,g_a_00,local_88,local_38,local_40,
               local_48,local_78,local_50,local_68,local_70,local_80,(long)g_c,(long)(cilo + 1),
               (long)(cihi + 1),(long)(cjlo + 1),(long)(cjhi + 1));
  }
  return;
}

Assistant:

void GA_Matmul_patch(char transa, char transb, void* alpha, void *beta,
		     int g_a, int ailo, int aihi, int ajlo, int ajhi,
		     int g_b, int bilo, int bihi, int bjlo, int bjhi,
		     int g_c, int cilo, int cihi, int cjlo, int cjhi)

{
    Integer Ig_a = g_a;
    Integer Ig_b = g_b;
    Integer Ig_c = g_c;
#if 0
    Integer alo[2], ahi[2]; 
    Integer blo[2], bhi[2];
    Integer clo[2], chi[2];
    alo[0]=ailo+1; ahi[0]=aihi+1; alo[1]=ajlo+1; ahi[1]=ajhi+1;
    blo[0]=bilo+1; bhi[0]=bihi+1; blo[1]=bjlo+1; bhi[1]=bjhi+1;
    clo[0]=cilo+1; chi[0]=cihi+1; clo[1]=cjlo+1; chi[1]=cjhi+1;
    pnga_matmul_patch(transa, transb, alpha, beta, g_a, alo, ahi,
                         g_b, blo, bhi, g_c, clo, chi);
#else
    Integer Iailo=ailo+1, Iaihi=aihi+1, Iajlo=ajlo+1, Iajhi=ajhi+1;
    Integer Ibilo=bilo+1, Ibihi=bihi+1, Ibjlo=bjlo+1, Ibjhi=bjhi+1;
    Integer Icilo=cilo+1, Icihi=cihi+1, Icjlo=cjlo+1, Icjhi=cjhi+1;
    if(pnga_is_mirrored(Ig_a))
       wnga_matmul_mirrored(&transa, &transb, (void*)alpha, (void*)beta,
                  Ig_a, Iailo, Iaihi, Iajlo, Iajhi,
                  Ig_b, Ibilo, Ibihi, Ibjlo, Ibjhi,
                  Ig_c, Icilo, Icihi, Icjlo, Icjhi);
    else {
       gai_matmul_patch_flag(SET);
       wnga_matmul(&transa, &transb, (void*)alpha, (void*)beta,
             Ig_a, Iailo, Iaihi, Iajlo, Iajhi,
             Ig_b, Ibilo, Ibihi, Ibjlo, Ibjhi,
             Ig_c, Icilo, Icihi, Icjlo, Icjhi);
       gai_matmul_patch_flag(UNSET);
    }
#endif
}